

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::argSynopsis
          (CommandLine<Catch::ConfigData> *this,ostream *os)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  Arg *pAVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  string *psVar6;
  ostream *poVar7;
  logic_error *this_00;
  _Rb_tree_header *p_Var8;
  size_type *psVar9;
  uint uVar10;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (this->m_highestSpecifiedArgPosition < 1) {
    bVar4 = false;
  }
  else {
    p_Var1 = &(this->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header;
    uVar10 = 1;
    do {
      if (1 < uVar10) {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      }
      p_Var2 = (this->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
          p_Var2 = (&p_Var2->_M_left)[(int)*(size_t *)(p_Var2 + 1) < (int)uVar10]) {
        if ((int)uVar10 <= (int)*(size_t *)(p_Var2 + 1)) {
          p_Var5 = p_Var2;
        }
      }
      p_Var8 = p_Var1;
      if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
         (p_Var8 = (_Rb_tree_header *)p_Var5,
         (int)uVar10 < (int)((_Rb_tree_header *)p_Var5)->_M_node_count)) {
        p_Var8 = p_Var1;
      }
      if (p_Var8 == p_Var1) {
        if ((this->m_floatingArg)._M_ptr == (Arg *)0x0) {
          this_00 = (logic_error *)__cxa_allocate_exception(0x10);
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_50,"non consecutive positional arguments with no floating args"
                     ,"");
          std::logic_error::logic_error(this_00,(string *)local_50);
          __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"<",1);
        pAVar3 = (this->m_floatingArg)._M_ptr;
        psVar6 = &(pAVar3->super_CommonArgProperties<Catch::ConfigData>).placeholder;
        psVar9 = &(pAVar3->super_CommonArgProperties<Catch::ConfigData>).placeholder.
                  _M_string_length;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(os,"<",1);
        psVar6 = (string *)((long)(p_Var8 + 2) + 0x20);
        psVar9 = (size_type *)(p_Var8 + 3);
      }
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(psVar6->_M_dataplus)._M_p,*psVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,">",1);
      bVar4 = (int)uVar10 < this->m_highestSpecifiedArgPosition;
      uVar10 = uVar10 + 1;
    } while (bVar4);
    bVar4 = 1 < this->m_highestSpecifiedArgPosition;
  }
  if ((this->m_floatingArg)._M_ptr != (Arg *)0x0) {
    if (bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"[<",2);
    pAVar3 = (this->m_floatingArg)._M_ptr;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(pAVar3->super_CommonArgProperties<Catch::ConfigData>).placeholder.
                           _M_dataplus._M_p,
                        (pAVar3->super_CommonArgProperties<Catch::ConfigData>).placeholder.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"> ...]",6);
    return;
  }
  return;
}

Assistant:

void argSynopsis( std::ostream& os ) const {
            for( int i = 1; i <= m_highestSpecifiedArgPosition; ++i ) {
                if( i > 1 )
                    os << " ";
                typename std::map<int, Arg>::const_iterator it = m_positionalArgs.find( i );
                if( it != m_positionalArgs.end() )
                    os << "<" << it->second.placeholder << ">";
                else if( m_floatingArg.get() )
                    os << "<" << m_floatingArg->placeholder << ">";
                else
                    throw std::logic_error( "non consecutive positional arguments with no floating args" );
            }
            // !TBD No indication of mandatory args
            if( m_floatingArg.get() ) {
                if( m_highestSpecifiedArgPosition > 1 )
                    os << " ";
                os << "[<" << m_floatingArg->placeholder << "> ...]";
            }
        }